

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  pointer *ppLVar1;
  pointer pLVar2;
  pointer pFVar3;
  Type *pTVar4;
  iterator __position;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  Index IVar9;
  Result RVar10;
  ulong uVar11;
  Type *pTVar12;
  TypeVector local_48;
  
  sVar6 = (loc->filename)._M_len;
  pcVar7 = (loc->filename)._M_str;
  uVar8 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar8;
  (this->expr_loc_).filename._M_len = sVar6;
  (this->expr_loc_).filename._M_str = pcVar7;
  pLVar2 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    (this->locals_).
    super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2;
  }
  uVar5 = (ulong)func_index;
  pFVar3 = (this->funcs_).
           super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->funcs_).
                  super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 3) *
           0x6db6db6db6db6db7;
  if (uVar11 < uVar5 || uVar11 - uVar5 == 0) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar10 = TypeChecker::BeginFunction(&this->typechecker_,&local_48);
    if ((Type)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start != (Type)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pTVar12 = *(Type **)&pFVar3[uVar5].params.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl;
    pTVar4 = *(pointer *)
              ((long)&pFVar3[uVar5].params.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
    if (pTVar12 != pTVar4) {
      do {
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)pTVar12;
        pLVar2 = (this->locals_).
                 super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar2) {
          IVar9 = 1;
        }
        else {
          IVar9 = pLVar2[-1].end + 1;
        }
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,IVar9);
        __position._M_current =
             (this->locals_).
             super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
          ::_M_realloc_insert<wabt::SharedValidator::LocalDecl>
                    (&this->locals_,__position,(LocalDecl *)&local_48);
        }
        else {
          (__position._M_current)->end = IVar9;
          (__position._M_current)->type =
               (Type)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppLVar1 = &(this->locals_).
                     super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pTVar12 = pTVar12 + 1;
      } while (pTVar12 != pTVar4);
    }
    RVar10 = TypeChecker::BeginFunction
                       (&this->typechecker_,
                        &(this->funcs_).
                         super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].results);
  }
  return (Result)RVar10.enum_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}